

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_pax_sparse.c
# Opt level: O2

void test_compat_solaris_pax_sparse(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *paVar4;
  ulong uVar5;
  char *pcVar6;
  time_t tVar7;
  la_int64_t lVar8;
  void *pvVar9;
  size_t l;
  char *ld;
  archive_entry *ae;
  int64_t offset;
  size_t bytes_read;
  void *buff;
  archive_conflict *local_2078;
  int64_t length;
  char name [39];
  char data [8192];
  
  builtin_strncpy(name,"test_compat_solaris_pax_sparse_1.pax.Z",0x27);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                   ,L'*',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file(name);
  wVar2 = archive_read_open_filename(paVar4,name,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'.',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&ae);
  local_2078 = paVar4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",paVar4
                     );
  if (iVar1 == 0) {
    pcVar6 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'6',"hole","\"hole\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar7 = archive_entry_mtime(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'7',0x4e1b4ba3,"1310411683",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_uid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'8',0x65,"101",lVar8,"archive_entry_uid(ae)",(void *)0x0);
    pcVar6 = archive_entry_uname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'9',"cue","\"cue\"",pcVar6,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar8 = archive_entry_gid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L':',10,"10",lVar8,"archive_entry_gid(ae)",(void *)0x0);
    pcVar6 = archive_entry_gname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L';',"staff","\"staff\"",pcVar6,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'<',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    failure("This sparse file should have three data blocks");
    wVar2 = archive_entry_sparse_reset(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'@',3,"3",(long)wVar2,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar2 = archive_entry_sparse_next(ae,&offset,&length);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'B',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'C',0,"0",offset,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'D',0x20000,"131072",length,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(ae,&offset,&length);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'F',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'G',0x60000,"393216",offset,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'H',0x20000,"131072",length,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(ae,&offset,&length);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'J',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'K',0xc0000,"786432",offset,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'L',0x8007,"32775",length,"length",(void *)0x0);
LAB_001385fe:
    iVar1 = archive_read_data_block((archive *)local_2078,&buff,&bytes_read,&offset);
    paVar4 = local_2078;
    if (iVar1 == 0) {
      failure("The data blocks should not include the hole");
      uVar5 = bytes_read + offset;
      if (offset < 0) {
LAB_0013865a:
        wVar2 = (wchar_t)(uVar5 < 0xc8008 && 0xbffff < offset);
      }
      else {
        wVar2 = L'\x01';
        if ((0x20000 < uVar5) && ((ulong)offset < 0x60000 || 0x80000 < uVar5)) goto LAB_0013865a;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                       ,L'R',wVar2,
                       "(offset >= 0 && offset + bytes_read <= 131072) || (offset >= 393216 && offset + bytes_read <= 393216+131072) || (offset >= 786432 && offset + bytes_read <= 786432+32775)"
                       ,(void *)0x0);
      if (bytes_read < 0x2000 || offset != 0) goto LAB_00138704;
      memset(data,0x61,0x2000);
      failure("First data block should be 8K bytes of \'a\'");
      ld = "sizeof(data)";
      l = 0x2000;
      wVar2 = L'V';
      pcVar6 = "buff";
      pvVar9 = buff;
      goto LAB_0013878d;
    }
    iVar1 = archive_read_next_header((archive *)local_2078,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'a',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'd',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                        (void *)0x0);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'e',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)local_2078);
  }
  builtin_strncpy(data,"test_compat_solaris_pax_sparse_2.pax.Z",0x27);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                   ,L'z',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file(data);
  wVar2 = archive_read_open_filename(paVar4,data,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'~',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",
                      paVar4);
  if (iVar1 == 0) {
    pcVar6 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x86',"hole","\"hole\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar7 = archive_entry_mtime(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x87',0x4e1b5f95,"1310416789",tVar7,"archive_entry_mtime(ae)",(void *)0x0
                       );
    lVar8 = archive_entry_uid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x88',0x65,"101",lVar8,"archive_entry_uid(ae)",(void *)0x0);
    pcVar6 = archive_entry_uname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x89',"cue","\"cue\"",pcVar6,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar8 = archive_entry_gid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8a',10,"10",lVar8,"archive_entry_gid(ae)",(void *)0x0);
    pcVar6 = archive_entry_gname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x8b',"staff","\"staff\"",pcVar6,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8c',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0)
    ;
    failure("This sparse file should have two data blocks");
    wVar2 = archive_entry_sparse_reset(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x90',2,"2",(long)wVar2,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar2 = archive_entry_sparse_next(ae,&offset,&length);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x92',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x93',0x60000,"393216",offset,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x94',0x20000,"131072",length,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(ae,&offset,&length);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x97',0xc0000,"786432",offset,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x98',0x801f,"32799",length,"length",(void *)0x0);
    while( true ) {
      iVar1 = archive_read_data_block((archive *)paVar4,&buff,&bytes_read,&offset);
      if (iVar1 != 0) break;
      failure("The data blocks should not include the hole");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                       ,L'\x9d',(uint)(bytes_read + offset < 0xc8020 && 0xbffff < offset ||
                                      bytes_read + offset < 0x80001 && 0x5ffff < offset),
                       "(offset >= 393216 && offset + bytes_read <= 393216+131072) || (offset >= 786432 && offset + bytes_read <= 786432+32799)"
                       ,(void *)0x0);
      if ((0x1e < bytes_read) && (offset + bytes_read == 0xc801f)) {
        pvVar9 = (void *)((long)buff + (bytes_read - 0x1f));
        builtin_strncpy(name,"ccccccccccccccccccccccccccccccc",0x1f);
        failure("Last 31 bytes should be all \'c\'");
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                            ,L'¤',pvVar9,"last",name,"data",0x1f,"31",(void *)0x0);
      }
    }
    iVar1 = archive_read_next_header((archive *)paVar4,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'©',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                       );
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¬',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                        (void *)0x0);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'­',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'°',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)paVar4);
  }
  return;
LAB_00138704:
  if (6 < bytes_read && offset + bytes_read == 0xc8007) {
    pvVar9 = (void *)((long)buff + (bytes_read - 7));
    builtin_strncpy(data,"ccccccc",7);
    failure("Last seven bytes should be all \'c\'");
    ld = "7";
    l = 7;
    wVar2 = L'\\';
    pcVar6 = "last";
LAB_0013878d:
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,wVar2,pvVar9,pcVar6,data,"data",l,ld,(void *)0x0);
  }
  goto LAB_001385fe;
}

Assistant:

static void
test_compat_solaris_pax_sparse_1(void)
{
	char name[] = "test_compat_solaris_pax_sparse_1.pax.Z";
	struct archive_entry *ae;
	struct archive *a;
	int64_t offset, length;
	const void *buff;
	size_t bytes_read;
	char data[1024*8];
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString("hole", archive_entry_pathname(ae));
	assertEqualInt(1310411683, archive_entry_mtime(ae));
	assertEqualInt(101, archive_entry_uid(ae));
	assertEqualString("cue", archive_entry_uname(ae));
	assertEqualInt(10, archive_entry_gid(ae));
	assertEqualString("staff", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Verify the sparse information. */
	failure("This sparse file should have three data blocks");
	assertEqualInt(3, archive_entry_sparse_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(0, offset);
	assertEqualInt(131072, length);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(393216, offset);
	assertEqualInt(131072, length);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(786432, offset);
	assertEqualInt(32775, length);
	while (ARCHIVE_OK ==
	    archive_read_data_block(a, &buff, &bytes_read, &offset)) {
		failure("The data blocks should not include the hole");
		assert((offset >= 0 && offset + bytes_read <= 131072) ||
		       (offset >= 393216 && offset + bytes_read <= 393216+131072) ||
		       (offset >= 786432 && offset + bytes_read <= 786432+32775));
		if (offset == 0 && bytes_read >= 1024*8) {
			memset(data, 'a', sizeof(data));
			failure("First data block should be 8K bytes of 'a'");
			assertEqualMem(buff, data, sizeof(data));
		} else if (offset + bytes_read == 819207 && bytes_read >= 7) {
			const char *last = buff;
			last += bytes_read - 7;
			memset(data, 'c', 7);
			failure("Last seven bytes should be all 'c'");
			assertEqualMem(last, data, 7);
		}
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}